

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void rgbx_8888_to_argb_4444
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  short *psVar1;
  ushort uVar2;
  uint *puVar3;
  short *psVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = (long)width;
  puVar3 = (uint *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
  psVar4 = (short *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
  iVar5 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar5 != height; iVar5 = iVar5 + 1) {
    psVar1 = psVar4 + lVar6;
    for (; psVar4 < psVar1; psVar4 = psVar4 + 1) {
      uVar2 = (ushort)(*puVar3 >> 0x10);
      *psVar4 = (uVar2 >> 4 & 0xf00) + (uVar2 & 0xf0 | (ushort)(*puVar3 >> 0xc) & 0xf) + -0x1000;
      puVar3 = puVar3 + 1;
    }
    puVar3 = puVar3 + (src_pitch / 4 - lVar6);
    psVar4 = psVar4 + (dst_pitch / 2 - lVar6);
  }
  return;
}

Assistant:

static void rgbx_8888_to_argb_4444(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBX_8888_TO_ARGB_4444(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}